

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

ZNode * binary_op_ZNode(SNode *sn)

{
  SNode *pSVar1;
  ZNode *pZVar2;
  ZNode *pZVar3;
  AssocKind AVar4;
  
  if ((sn->zns).n != 1) {
    return (ZNode *)0x0;
  }
  pZVar3 = *(sn->zns).v;
  AVar4 = pZVar3->pn->op_assoc;
  if (AVar4 == ASSOC_UNARY_RIGHT) {
    if ((pZVar3->sns).n != 1) {
      return (ZNode *)0x0;
    }
    pSVar1 = *(pZVar3->sns).v;
    if ((pSVar1->zns).n != 1) {
      return (ZNode *)0x0;
    }
    pZVar3 = *(pSVar1->zns).v;
    AVar4 = pZVar3->pn->op_assoc;
  }
  pZVar2 = (ZNode *)0x0;
  if ((AVar4 & 0x10) != ASSOC_NONE) {
    pZVar2 = pZVar3;
  }
  return pZVar2;
}

Assistant:

static ZNode *binary_op_ZNode(SNode *sn) {
  ZNode *z;
  if (sn->zns.n != 1) return NULL;
  z = sn->zns.v[0];
  if (z->pn->op_assoc == ASSOC_UNARY_RIGHT) {
    if (z->sns.n != 1) return NULL;
    sn = z->sns.v[0];
    if (sn->zns.n != 1) return NULL;
    z = sn->zns.v[0];
  }
  if (!IS_BINARY_ASSOC(z->pn->op_assoc)) return NULL;
  return z;
}